

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O1

void gimage::fillGammaMap<float>
               (Image<float,_gimage::PixelTraits<float>_> *map,int depth,int from,int to,double g)

{
  float ***pppfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int i;
  ulong uVar10;
  double dVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  if (0 < from) {
    pppfVar1 = map->img;
    uVar7 = 0;
    uVar10 = map->width;
    if (map->width < 1) {
      uVar10 = uVar7;
    }
    do {
      if (uVar10 == uVar7) break;
      (*pppfVar1[depth])[uVar7] = -3.4028235e+38;
      uVar7 = uVar7 + 1;
    } while ((uint)from != uVar7);
  }
  if (0 < to) {
    uVar10 = 0;
    do {
      if (map->width <= (long)uVar10) break;
      dVar11 = pow((double)((int)uVar10 - from) / (double)(to - from),1.0 / g);
      (*map->img[depth])[uVar10] = (float)(dVar11 * 3.4028234663852886e+38);
      uVar10 = uVar10 + 1;
    } while ((uint)to != uVar10);
  }
  auVar5 = _DAT_0014f180;
  auVar4 = _DAT_0014f170;
  auVar3 = _DAT_0014f160;
  lVar6 = (long)to;
  lVar8 = map->width - lVar6;
  if (lVar8 != 0 && lVar6 <= map->width) {
    pfVar2 = *map->img[depth];
    lVar9 = lVar8 + -1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar12 = auVar12 ^ _DAT_0014f180;
    do {
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pfVar2[lVar6 + uVar10] = 3.4028235e+38;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pfVar2[lVar6 + uVar10 + 1] = 3.4028235e+38;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        pfVar2[lVar6 + uVar10 + 2] = 3.4028235e+38;
        pfVar2[lVar6 + uVar10 + 3] = 3.4028235e+38;
      }
      uVar10 = uVar10 + 4;
    } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar10);
  }
  return;
}

Assistant:

void fillGammaMap(Image<T> &map, int depth, int from, int to, double g)
{
  for (int i=0; i<from && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMinValue());
  }

  for (int i=0; i<to && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, static_cast<T>(map.absMaxValue()*pow(static_cast<double>(i-from)/
                   (to-from), 1.0/g)));
  }

  for (int i=to; i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMaxValue());
  }
}